

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

cTValue * lj_tab_getstr(GCtab *t,GCstr *key)

{
  cTValue *pcVar1;
  
  pcVar1 = (cTValue *)((ulong)(t->hmask & key->hash) * 0x18 + (ulong)(t->node).ptr32);
  while ((*(int *)((long)pcVar1 + 0xc) != -5 || ((GCstr *)(ulong)pcVar1[1].u32.lo != key))) {
    pcVar1 = (cTValue *)(ulong)pcVar1[2].u32.lo;
    if (pcVar1 == (cTValue *)0x0) {
      return (cTValue *)0x0;
    }
  }
  return pcVar1;
}

Assistant:

cTValue *lj_tab_getstr(GCtab *t, GCstr *key)
{
  Node *n = hashstr(t, key);
  do {
    if (tvisstr(&n->key) && strV(&n->key) == key)
      return &n->val;
  } while ((n = nextnode(n)));
  return NULL;
}